

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_7f91c2::TryReachPresetFromWorkflow<cmCMakePresetsGraph::ConfigurePreset>
          (WorkflowPreset *origin,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
          *presets,string *name,ConfigurePreset **configurePreset)

{
  File *pFVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  ConfigurePreset **configurePreset_local;
  string *name_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *presets_local;
  WorkflowPreset *origin_local;
  
  it._M_node = (_Base_ptr)configurePreset;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
       ::find(presets,name);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
       ::end(presets);
  bVar2 = std::operator==(&local_38,&local_40);
  if (bVar2) {
    origin_local._4_4_ = INVALID_WORKFLOW_STEPS;
  }
  else {
    pFVar1 = (origin->super_Preset).OriginFile;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
             ::operator->(&local_38);
    sVar4 = std::
            unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
            ::count(&pFVar1->ReachableFiles,&(ppVar3->second).Unexpanded.super_Preset.OriginFile);
    if (sVar4 == 0) {
      origin_local._4_4_ = WORKFLOW_STEP_UNREACHABLE_FROM_FILE;
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
               ::operator->(&local_38);
      origin_local._4_4_ =
           SetupWorkflowConfigurePreset<cmCMakePresetsGraph::ConfigurePreset>
                     (&(ppVar3->second).Unexpanded,(ConfigurePreset **)it._M_node);
    }
  }
  return origin_local._4_4_;
}

Assistant:

ReadFileResult TryReachPresetFromWorkflow(
  const WorkflowPreset& origin,
  const std::map<std::string, PresetPair<T>>& presets, const std::string& name,
  const ConfigurePreset*& configurePreset)
{
  auto it = presets.find(name);
  if (it == presets.end()) {
    return ReadFileResult::INVALID_WORKFLOW_STEPS;
  }
  if (!origin.OriginFile->ReachableFiles.count(
        it->second.Unexpanded.OriginFile)) {
    return ReadFileResult::WORKFLOW_STEP_UNREACHABLE_FROM_FILE;
  }
  return SetupWorkflowConfigurePreset<T>(it->second.Unexpanded,
                                         configurePreset);
}